

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_map_based.cpp
# Opt level: O2

void __thiscall
so_5::impl::map_based_subscr_storage::storage_t::drop_subscription_for_all_states
          (storage_t *this,mbox_t *mbox,type_index *msg_type)

{
  abstract_message_box_t *paVar1;
  iterator __position;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  agent_t *paVar4;
  iterator lower_bound;
  anon_class_24_3_586eed86 need_erase;
  is_same_mbox_msg is_same;
  iterator local_60;
  anon_class_24_3_586eed86 local_58;
  is_same_mbox_msg local_40;
  
  iVar3 = (*mbox->m_obj->_vptr_abstract_message_box_t[2])();
  local_40.m_id = CONCAT44(extraout_var,iVar3);
  local_40.m_type = msg_type;
  iVar3 = (*mbox->m_obj->_vptr_abstract_message_box_t[2])();
  local_58.lower_bound = (iterator *)CONCAT44(extraout_var_00,iVar3);
  local_58.this = (storage_t *)msg_type->_M_target;
  local_58.is_same = (is_same_mbox_msg *)0x0;
  local_60 = std::
             _Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,_std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>,_std::_Select1st<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
             ::lower_bound(&(this->m_events)._M_t,(key_type *)&local_58);
  local_58.lower_bound = &local_60;
  local_58.this = this;
  local_58.is_same = &local_40;
  bVar2 = drop_subscription_for_all_states::anon_class_24_3_586eed86::operator()(&local_58);
  if (bVar2) {
    do {
      __position._M_node = local_60._M_node;
      local_60._M_node = (_Base_ptr)std::_Rb_tree_increment(local_60._M_node);
      std::
      _Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>,std::_Select1st<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
      ::erase_abi_cxx11_((_Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>,std::_Select1st<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
                          *)&this->m_events,__position);
      bVar2 = drop_subscription_for_all_states::anon_class_24_3_586eed86::operator()(&local_58);
    } while (bVar2);
    paVar1 = mbox->m_obj;
    paVar4 = subscription_storage_t::owner(&this->super_subscription_storage_t);
    (*paVar1->_vptr_abstract_message_box_t[4])(paVar1,msg_type,paVar4);
  }
  return;
}

Assistant:

void
storage_t::drop_subscription_for_all_states(
	const mbox_t & mbox,
	const std::type_index & msg_type )
	{
		const is_same_mbox_msg is_same{ mbox->id(), msg_type };

		auto lower_bound = m_events.lower_bound(
				key_t{ mbox->id(), msg_type, nullptr } );

		auto need_erase = [&] {
				return lower_bound != std::end(m_events) &&
						is_same( lower_bound->first );
			};
		const bool events_found = need_erase();

		if( events_found )
			{
				do
					{
						m_events.erase( lower_bound++ );
					}
				while( need_erase() );

				// Note: since v.5.5.9 mbox unsubscription is initiated even if
				// it is MPSC mboxes. It is important for the case of message
				// delivery tracing.

				mbox->unsubscribe_event_handlers( msg_type, owner() );
			}
	}